

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O2

void operator_delete(void *p,align_val_t param_2)

{
  PagemapEntry *entry;
  undefined1 *puVar1;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this;
  long lVar2;
  code *pcVar3;
  ulong uVar4;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *pDVar5;
  ulong uVar6;
  long lVar7;
  BackendSlabMetadata *meta;
  undefined8 *in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_28;
  
  pDVar5 = snmalloc::
           BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
           ::concretePagemap.body;
  this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
         *in_FS_OFFSET;
  uVar4 = (ulong)p >> 0xe;
  entry = snmalloc::
          BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
          ::concretePagemap.body + uVar4;
  uVar6 = snmalloc::
          BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
          ::concretePagemap.body[uVar4].
          super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
          .super_MetaEntryBase.remote_and_sizeclass;
  if (&this->remote_alloc ==
      (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)
      (uVar6 & 0xffffffffffffff80)) {
    uVar6 = (ulong)(((uint)uVar6 & 0x7f) << 5);
    if (*(ulong *)(snmalloc::sizeclass_metadata + uVar6 + 0x18) <=
        (*(ulong *)(snmalloc::sizeclass_metadata + uVar6 + 8) & (ulong)p) *
        *(ulong *)(snmalloc::sizeclass_metadata + uVar6 + 0x18)) goto LAB_0010c698;
    uVar6 = (entry->
            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
            ).super_MetaEntryBase.meta;
    meta = (BackendSlabMetadata *)(uVar6 & 0xfffffffffffffffe);
    snmalloc::freelist::
    Builder<true,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
    ::add(&(meta->
           super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
           ).free_queue,
          (BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
           )p,&snmalloc::freelist::Object::key_root,uVar6 >> 3,&this->entropy);
    puVar1 = &(meta->
              super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
              ).free_queue.field_0x24;
    *(short *)puVar1 = *(short *)puVar1 + -1;
    if (*(short *)puVar1 == 0) {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow(this,(Alloc<void>)p,entry,meta);
      return;
    }
  }
  else if ((undefined1 *)(uVar6 & 0xffffffffffffff80) == (undefined1 *)0x0) {
    if (p != (void *)0x0) goto LAB_0010c698;
  }
  else {
    if ((char)uVar6 < '\0') {
LAB_0010c698:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    lVar2 = (this->remote_dealloc_cache).capacity;
    lVar7 = lVar2 - *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar6 & 0x7f) << 5));
    if (lVar7 == 0 || lVar2 < *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar6 & 0x7f) << 5)))
    {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_remote_slow<snmalloc::CheckInitPthread>(this,entry,(Alloc<void>)p);
      return;
    }
    (this->remote_dealloc_cache).capacity = lVar7;
    local_28.this = &this->remote_dealloc_cache;
    if (p != (void *)0x0) {
      *(undefined8 *)p = 0;
      *(undefined8 *)((long)p + 8) = 0;
      pDVar5 = snmalloc::
               BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
               ::concretePagemap.body;
    }
    uVar6 = pDVar5[uVar4].
            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
            .super_MetaEntryBase.remote_and_sizeclass;
    if (p != (void *)0x0) {
      *(undefined8 *)p = 0;
      *(undefined8 *)((long)p + 8) = 0;
    }
    snmalloc::
    RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
    dealloc<11008UL>::anon_class_8_1_8991fb9c::operator()
              (&local_28,uVar6 & 0xffffffffffffff80,(Alloc<RemoteMessage>)p);
  }
  return;
}

Assistant:

void operator delete(void* p, std::align_val_t) EXCEPTSPEC
{
  snmalloc::libc::free(p);
}